

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

int __thiscall chrono::ChSystem::FileProcessChR(ChSystem *this,ChStreamInBinary *m_file)

{
  bool bVar1;
  ChException *pCVar2;
  allocator local_79;
  string mchunk;
  string local_58;
  string local_38;
  
  mchunk._M_dataplus._M_p = (pointer)&mchunk.field_2;
  mchunk._M_string_length = 0;
  mchunk.field_2._M_local_buf[0] = '\0';
  ChStreamInBinary::operator>>(m_file,&mchunk);
  bVar1 = std::operator!=(&mchunk,"Chrono binary file start");
  if (bVar1) {
    pCVar2 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_38,"Not a ChR data file.",&local_79);
    ChException::ChException(pCVar2,&local_38);
    __cxa_throw(pCVar2,&ChException::typeinfo,ChException::~ChException);
  }
  ChStreamInBinary::operator>>(m_file,&mchunk);
  bVar1 = std::operator!=(&mchunk,"Chrono binary file end");
  if (!bVar1) {
    std::__cxx11::string::~string((string *)&mchunk);
    return 1;
  }
  pCVar2 = (ChException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_58,"The end of ChR data file is badly formatted.",&local_79);
  ChException::ChException(pCVar2,&local_58);
  __cxa_throw(pCVar2,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

int ChSystem::FileProcessChR(ChStreamInBinary& m_file) {
    std::string mchunk;

    m_file >> mchunk;
    if (mchunk != CH_CHUNK_START)
        throw ChException("Not a ChR data file.");

    // StreamINall(m_file);

    m_file >> mchunk;
    if (mchunk != CH_CHUNK_END)
        throw ChException("The end of ChR data file is badly formatted.");

    return 1;
}